

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

MovePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_> *
__thiscall
deqp::egl::Image::TextureImageSource::createBuffer
          (MovePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
           *__return_storage_ptr__,TextureImageSource *this,Functions *gl,Texture2D *ref)

{
  glTexImage2DFunc p_Var1;
  PtrData<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_> data;
  GLenum GVar2;
  GLenum GVar3;
  deBool dVar4;
  EGLenum source;
  TextureClientBuffer *pTVar5;
  PixelBufferAccess *pPVar6;
  void *pvVar7;
  char *this_00;
  GLenum in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  GLenum in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  TextureFormat local_b0;
  Texture2D local_a8;
  GLenum local_54;
  GLenum local_50;
  GLenum imgTarget;
  GLenum target;
  GLuint texture;
  undefined1 local_38 [8];
  MovePtr<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  clientBuffer;
  Texture2D *ref_local;
  Functions *gl_local;
  TextureImageSource *this_local;
  
  clientBuffer.
  super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  .m_data._8_8_ = ref;
  pTVar5 = (TextureClientBuffer *)operator_new(0x20);
  TextureClientBuffer::TextureClientBuffer(pTVar5,gl);
  de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>::DefaultDeleter
            ((DefaultDeleter<deqp::egl::Image::TextureClientBuffer> *)((long)&target + 3));
  de::details::
  MovePtr<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  ::MovePtr((MovePtr<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
             *)local_38,pTVar5);
  pTVar5 = de::details::
           UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
           ::operator->((UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
                         *)local_38);
  imgTarget = (*(pTVar5->super_GLClientBuffer).super_ClientBuffer._vptr_ClientBuffer[3])();
  local_50 = (*(this->super_GLImageSource).super_ImageSource._vptr_ImageSource[9])();
  do {
    (*gl->bindTexture)(local_50,imgTarget);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"bindTexture(target, texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0xee);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  (*(this->super_GLImageSource).super_ImageSource._vptr_ImageSource[8])();
  if ((this->m_useTexLevel0 & 1U) == 0) {
    do {
      (*gl->texParameteri)(local_50,0x2801,0x2601);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0xf4);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  if (clientBuffer.
      super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
      .m_data._8_8_ != 0) {
    source = (*(this->super_GLImageSource).super_ImageSource._vptr_ImageSource[7])();
    local_54 = eglu::getImageGLTarget(source);
    local_b0 = glu::mapGLTransferFormat(this->m_format,this->m_type);
    tcu::Texture2D::Texture2D(&local_a8,&local_b0,0x40,0x40);
    tcu::Texture2D::operator=
              ((Texture2D *)
               clientBuffer.
               super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
               .m_data._8_8_,&local_a8);
    tcu::Texture2D::~Texture2D(&local_a8);
    tcu::Texture2D::allocLevel
              ((Texture2D *)
               clientBuffer.
               super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
               .m_data._8_8_,0);
    pPVar6 = tcu::TextureLevelPyramid::getLevel
                       ((TextureLevelPyramid *)
                        clientBuffer.
                        super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
                        .m_data._8_8_,0);
    tcu::Vector<float,_4>::Vector(&local_c0,0.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector(&local_d0,1.0,1.0,1.0,1.0);
    tcu::fillWithComponentGradients(pPVar6,&local_c0,&local_d0);
    do {
      (*gl->texParameteri)(local_50,0x2801,0x2601);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x101);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      (*gl->texParameteri)(local_50,0x2800,0x2601);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_LINEAR)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x102);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      (*gl->texParameteri)(local_50,0x2803,0x812f);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x103);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      (*gl->texParameteri)(local_50,0x2802,0x812f);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"texParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x104);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      GVar2 = local_54;
      p_Var1 = gl->texImage2D;
      GVar3 = this->m_internalFormat;
      in_stack_fffffffffffffe48 = this->m_format;
      in_stack_fffffffffffffe50 = this->m_type;
      pPVar6 = tcu::TextureLevelPyramid::getLevel
                         ((TextureLevelPyramid *)
                          clientBuffer.
                          super_UniqueBase<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
                          .m_data._8_8_,0);
      pvVar7 = tcu::PixelBufferAccess::getDataPtr(pPVar6);
      (*p_Var1)(GVar2,0,GVar3,0x40,0x40,0,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,pvVar7
               );
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,
                      "texImage2D(imgTarget, 0, m_internalFormat, IMAGE_WIDTH, IMAGE_HEIGHT, 0, m_format, m_type, ref->getLevel(0).getDataPtr())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x107);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  do {
    (*gl->bindTexture)(local_50,0);
    GVar3 = (*gl->getError)();
    this_00 = "bindTexture(target, 0)";
    glu::checkError(GVar3,"bindTexture(target, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x109);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>
              *)local_38,(MovePtr *)this_00);
  data.ptr._4_4_ = in_stack_fffffffffffffe4c;
  data.ptr._0_4_ = in_stack_fffffffffffffe48;
  data._8_4_ = in_stack_fffffffffffffe50;
  data._12_4_ = in_stack_fffffffffffffe54;
  de::details::
  MovePtr<deqp::egl::Image::ClientBuffer,_de::DefaultDeleter<deqp::egl::Image::ClientBuffer>_>::
  MovePtr(__return_storage_ptr__,data);
  de::details::
  MovePtr<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
  ::~MovePtr((MovePtr<deqp::egl::Image::TextureClientBuffer,_de::DefaultDeleter<deqp::egl::Image::TextureClientBuffer>_>
              *)local_38);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ClientBuffer> TextureImageSource::createBuffer (const glw::Functions& gl, Texture2D* ref) const
{
	MovePtr<TextureClientBuffer>	clientBuffer	(new TextureClientBuffer(gl));
	const GLuint					texture			= clientBuffer->getName();
	const GLenum					target			= getGLTarget();

	GLU_CHECK_GLW_CALL(gl, bindTexture(target, texture));
	initTexture(gl);

	if (!m_useTexLevel0)
	{
		// Set minification filter to linear. This makes the texture complete.
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
	}

	if (ref != DE_NULL)
	{
		GLenum		imgTarget	= eglu::getImageGLTarget(getSource());

		*ref = Texture2D(glu::mapGLTransferFormat(m_format, m_type), IMAGE_WIDTH, IMAGE_HEIGHT);
		ref->allocLevel(0);
		tcu::fillWithComponentGradients(ref->getLevel(0),
										tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f),
										tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_LINEAR));
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE));
		GLU_CHECK_GLW_CALL(gl, texParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE));

		GLU_CHECK_GLW_CALL(gl, texImage2D(imgTarget, 0, m_internalFormat, IMAGE_WIDTH, IMAGE_HEIGHT,
										  0, m_format, m_type, ref->getLevel(0).getDataPtr()));
	}
	GLU_CHECK_GLW_CALL(gl, bindTexture(target, 0));
	return MovePtr<ClientBuffer>(clientBuffer);
}